

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::NegativeTestBase::testDrawArray(NegativeTestBase *this,bool use_version_400)

{
  shaderSource *compute_shader;
  shaderSource tess_eval_data;
  shaderSource tess_ctrl_data;
  shaderSource geometry_data;
  shaderSource vertex_data;
  program program;
  shaderSource fragment_data;
  shaderSource local_1a8 [12];
  
  program.m_context = (this->super_TestBase).super_TestCase.m_context;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  fragment_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fragment_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fragment_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  geometry_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  geometry_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  geometry_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tess_ctrl_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tess_ctrl_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tess_ctrl_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tess_eval_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tess_eval_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tess_eval_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertex_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  TestBase::initShaderSource(&this->super_TestBase,FRAGMENT_SHADER,use_version_400,&fragment_data);
  TestBase::initShaderSource(&this->super_TestBase,GEOMETRY_SHADER,use_version_400,&geometry_data);
  TestBase::initShaderSource(&this->super_TestBase,TESS_CTRL_SHADER,use_version_400,&tess_ctrl_data)
  ;
  TestBase::initShaderSource(&this->super_TestBase,TESS_EVAL_SHADER,use_version_400,&tess_eval_data)
  ;
  TestBase::initShaderSource(&this->super_TestBase,VERTEX_SHADER,use_version_400,&vertex_data);
  compute_shader = local_1a8;
  local_1a8[0].m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8[0].m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0].m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Utils::program::build
            (&program,compute_shader,&fragment_data,&geometry_data,&tess_ctrl_data,&tess_eval_data,
             &vertex_data,(GLchar **)0x0,0,false);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&local_1a8[0].m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&vertex_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&tess_eval_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&tess_ctrl_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&geometry_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&fragment_data.m_parts);
  Utils::program::remove(&program,(char *)compute_shader);
  return false;
}

Assistant:

bool NegativeTestBase::testDrawArray(bool use_version_400)
{
	/* GL objects */
	Utils::program program(m_context);

	/* Shaders */
	Utils::shaderSource fragment_data;
	Utils::shaderSource geometry_data;
	Utils::shaderSource tess_ctrl_data;
	Utils::shaderSource tess_eval_data;
	Utils::shaderSource vertex_data;

	initShaderSource(Utils::FRAGMENT_SHADER, use_version_400, fragment_data);
	initShaderSource(Utils::GEOMETRY_SHADER, use_version_400, geometry_data);
	initShaderSource(Utils::TESS_CTRL_SHADER, use_version_400, tess_ctrl_data);
	initShaderSource(Utils::TESS_EVAL_SHADER, use_version_400, tess_eval_data);
	initShaderSource(Utils::VERTEX_SHADER, use_version_400, vertex_data);

	/* Build program */
	try
	{
		program.build(0 /* compute shader */, fragment_data, geometry_data, tess_ctrl_data, tess_eval_data, vertex_data,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Compilation failed, as expected. Verify that reason of failure is as expected */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Shader compilation error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}

	/* Build process succeded */
	return false;
}